

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

CURLcode file_connect(connectdata *conn,_Bool *done)

{
  void *pvVar1;
  size_t sStack_48;
  CURLcode result;
  size_t real_path_len;
  undefined8 *puStack_38;
  int fd;
  FILEPROTO *file;
  char *real_path;
  Curl_easy *data;
  _Bool *done_local;
  connectdata *conn_local;
  
  real_path = (char *)conn->data;
  puStack_38 = (undefined8 *)(((Curl_easy *)real_path)->req).protop;
  real_path_len._4_4_ = 0xffffffff;
  data = (Curl_easy *)done;
  done_local = (_Bool *)conn;
  conn_local._4_4_ =
       Curl_urldecode((Curl_easy *)real_path,(((Curl_easy *)real_path)->state).up.path,0,
                      (char **)&file,&stack0xffffffffffffffb8,false);
  if (conn_local._4_4_ == CURLE_OK) {
    pvVar1 = memchr(file,0,sStack_48);
    if (pvVar1 == (void *)0x0) {
      real_path_len._4_4_ = open64((char *)file,0);
      *puStack_38 = file;
      puStack_38[1] = file;
      *(int *)(puStack_38 + 2) = real_path_len._4_4_;
      if (((*(ulong *)(real_path + 0xf38) >> 0x1d & 1) == 0) && (real_path_len._4_4_ == -1)) {
        Curl_failf((Curl_easy *)real_path,"Couldn\'t open file %s",
                   *(undefined8 *)(real_path + 0x15e8));
        file_done((connectdata *)done_local,CURLE_FILE_COULDNT_READ_FILE,false);
        conn_local._4_4_ = CURLE_FILE_COULDNT_READ_FILE;
      }
      else {
        *(undefined1 *)&data->next = 1;
        conn_local._4_4_ = CURLE_OK;
      }
    }
    else {
      (*Curl_cfree)(file);
      conn_local._4_4_ = CURLE_URL_MALFORMAT;
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode file_connect(struct connectdata *conn, bool *done)
{
  struct Curl_easy *data = conn->data;
  char *real_path;
  struct FILEPROTO *file = data->req.protop;
  int fd = -1;
#ifdef DOS_FILESYSTEM
  size_t i;
  char *actual_path;
#endif
  size_t real_path_len;

  CURLcode result = Curl_urldecode(data, data->state.up.path, 0, &real_path,
                                   &real_path_len, FALSE);
  if(result)
    return result;

#ifdef DOS_FILESYSTEM
  /* If the first character is a slash, and there's
     something that looks like a drive at the beginning of
     the path, skip the slash.  If we remove the initial
     slash in all cases, paths without drive letters end up
     relative to the current directory which isn't how
     browsers work.

     Some browsers accept | instead of : as the drive letter
     separator, so we do too.

     On other platforms, we need the slash to indicate an
     absolute pathname.  On Windows, absolute paths start
     with a drive letter.
  */
  actual_path = real_path;
  if((actual_path[0] == '/') &&
      actual_path[1] &&
     (actual_path[2] == ':' || actual_path[2] == '|')) {
    actual_path[2] = ':';
    actual_path++;
    real_path_len--;
  }

  /* change path separators from '/' to '\\' for DOS, Windows and OS/2 */
  for(i = 0; i < real_path_len; ++i)
    if(actual_path[i] == '/')
      actual_path[i] = '\\';
    else if(!actual_path[i]) { /* binary zero */
      Curl_safefree(real_path);
      return CURLE_URL_MALFORMAT;
    }

  if(strncmp("\\\\", actual_path, 2))
    /* refuse to open path that starts with two backslashes */
    fd = open_readonly(actual_path, O_RDONLY|O_BINARY);
  file->path = actual_path;
#else
  if(memchr(real_path, 0, real_path_len)) {
    /* binary zeroes indicate foul play */
    Curl_safefree(real_path);
    return CURLE_URL_MALFORMAT;
  }

  fd = open_readonly(real_path, O_RDONLY);
  file->path = real_path;
#endif
  file->freepath = real_path; /* free this when done */

  file->fd = fd;
  if(!data->set.upload && (fd == -1)) {
    failf(data, "Couldn't open file %s", data->state.up.path);
    file_done(conn, CURLE_FILE_COULDNT_READ_FILE, FALSE);
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  *done = TRUE;

  return CURLE_OK;
}